

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d00101::BIP32PubkeyProvider::GetPubKey
          (BIP32PubkeyProvider *this,int pos,SigningProvider *arg,CPubKey *key_out,
          KeyOriginInfo *final_info_out,DescriptorCache *read_cache,DescriptorCache *write_cache)

{
  bool bVar1;
  DescriptorCache *this_00;
  size_type sVar2;
  void *in_RCX;
  CExtPubKey *in_RDI;
  undefined8 in_R8;
  long in_R9;
  long in_FS_OFFSET;
  long in_stack_00000008;
  uint entry;
  KeyPath *__range4;
  bool der;
  const_iterator __end4;
  const_iterator __begin4;
  KeyOriginInfo final_info_out_tmp;
  KeyOriginInfo parent_info;
  CExtKey lh_xprv;
  CExtKey xprv;
  CExtPubKey last_hardened_extkey;
  CExtPubKey parent_extkey;
  CExtPubKey final_extkey;
  CKeyID keyid;
  CExtPubKey *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb4;
  undefined1 in_stack_fffffffffffffbb5;
  undefined1 in_stack_fffffffffffffbb6;
  undefined1 in_stack_fffffffffffffbb7;
  undefined1 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbb9;
  undefined1 in_stack_fffffffffffffbba;
  undefined1 in_stack_fffffffffffffbbb;
  undefined1 in_stack_fffffffffffffbbc;
  undefined1 in_stack_fffffffffffffbbd;
  undefined1 in_stack_fffffffffffffbbe;
  undefined1 in_stack_fffffffffffffbbf;
  DescriptorCache *this_01;
  uint32_t key_exp_pos;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  BIP32PubkeyProvider *in_stack_fffffffffffffbe0;
  uint32_t in_stack_fffffffffffffbec;
  int iVar3;
  bool local_40d;
  byte local_3c9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  undefined1 local_36c [116];
  undefined1 local_2f8 [116];
  undefined1 local_284 [248];
  undefined1 local_18c [116];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  KeyOriginInfo::KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffba8);
  CPubKey::GetID((CPubKey *)in_RDI);
  this_01 = (DescriptorCache *)&stack0xffffffffffffffe4;
  this_00 = (DescriptorCache *)base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffffba8);
  base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffffba8);
  std::copy<unsigned_char*,unsigned_char*>
            ((uchar *)this_00,(uchar *)this_01,
             (uchar *)CONCAT17(in_stack_fffffffffffffbbf,
                               CONCAT16(in_stack_fffffffffffffbbe,
                                        CONCAT15(in_stack_fffffffffffffbbd,
                                                 CONCAT14(in_stack_fffffffffffffbbc,
                                                          CONCAT13(in_stack_fffffffffffffbbb,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffbba,
                                                  CONCAT11(in_stack_fffffffffffffbb9,
                                                           in_stack_fffffffffffffbb8))))))));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),in_stack_fffffffffffffc40
            );
  KeyOriginInfo::KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffba8,(KeyOriginInfo *)0x6f98af)
  ;
  if (*(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffba8,
               (value_type_conflict3 *)0x6f98df);
  }
  if (*(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffba8,
               (value_type_conflict3 *)0x6f9944);
  }
  local_28 = *(undefined4 *)(in_RDI[1].vchFingerprint + 3);
  local_38 = *(undefined8 *)((in_RDI->pubkey).vch + 0x3c);
  uStack_30._0_1_ = in_RDI[1].version[0];
  uStack_30._1_1_ = in_RDI[1].version[1];
  uStack_30._2_1_ = in_RDI[1].version[2];
  uStack_30._3_1_ = in_RDI[1].version[3];
  uStack_30._4_1_ = in_RDI[1].nDepth;
  uStack_30._5_1_ = in_RDI[1].vchFingerprint[0];
  uStack_30._6_1_ = in_RDI[1].vchFingerprint[1];
  uStack_30._7_1_ = in_RDI[1].vchFingerprint[2];
  local_48 = *(undefined8 *)((in_RDI->pubkey).vch + 0x2c);
  uStack_40 = *(undefined8 *)((in_RDI->pubkey).vch + 0x34);
  local_58 = *(undefined8 *)((in_RDI->pubkey).vch + 0x1c);
  uStack_50 = *(undefined8 *)((in_RDI->pubkey).vch + 0x24);
  local_98._0_4_ = in_RDI->nChild;
  local_98._4_1_ = (in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems[0];
  local_98._5_1_ = (in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems[1];
  local_98._6_1_ = (in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems[2];
  local_98._7_1_ = (in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems[3];
  uStack_90 = *(undefined8 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 4);
  local_88 = *(undefined8 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0xc);
  uStack_80 = *(undefined8 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0x14);
  local_78 = *(undefined8 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0x1c);
  uStack_70 = *(undefined8 *)((in_RDI->pubkey).vch + 4);
  local_68 = *(undefined8 *)((in_RDI->pubkey).vch + 0xc);
  uStack_60 = *(undefined8 *)((in_RDI->pubkey).vch + 0x14);
  local_a8 = *(undefined4 *)(in_RDI[1].vchFingerprint + 3);
  local_b8 = *(undefined8 *)((in_RDI->pubkey).vch + 0x3c);
  uStack_b0._0_1_ = in_RDI[1].version[0];
  uStack_b0._1_1_ = in_RDI[1].version[1];
  uStack_b0._2_1_ = in_RDI[1].version[2];
  uStack_b0._3_1_ = in_RDI[1].version[3];
  uStack_b0._4_1_ = in_RDI[1].nDepth;
  uStack_b0._5_1_ = in_RDI[1].vchFingerprint[0];
  uStack_b0._6_1_ = in_RDI[1].vchFingerprint[1];
  uStack_b0._7_1_ = in_RDI[1].vchFingerprint[2];
  local_c8 = *(undefined8 *)((in_RDI->pubkey).vch + 0x2c);
  uStack_c0 = *(undefined8 *)((in_RDI->pubkey).vch + 0x34);
  local_d8 = *(undefined8 *)((in_RDI->pubkey).vch + 0x1c);
  uStack_d0 = *(undefined8 *)((in_RDI->pubkey).vch + 0x24);
  local_118._0_4_ = in_RDI->nChild;
  local_118._4_1_ = (in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems[0];
  local_118._5_1_ = (in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems[1];
  local_118._6_1_ = (in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems[2];
  local_118._7_1_ = (in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems[3];
  uStack_110 = *(undefined8 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 4);
  local_108 = *(undefined8 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0xc);
  uStack_100 = *(undefined8 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0x14);
  local_f8 = *(undefined8 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0x1c);
  uStack_f0 = *(undefined8 *)((in_RDI->pubkey).vch + 4);
  local_e8 = *(undefined8 *)((in_RDI->pubkey).vch + 0xc);
  uStack_e0 = *(undefined8 *)((in_RDI->pubkey).vch + 0x14);
  CExtPubKey::CExtPubKey(in_stack_fffffffffffffba8);
  local_40d = true;
  if (in_R9 == 0) {
    in_stack_fffffffffffffbbc = IsHardened((BIP32PubkeyProvider *)this_01);
    if ((bool)in_stack_fffffffffffffbbc) {
      CExtKey::CExtKey((CExtKey *)in_stack_fffffffffffffba8);
      CExtKey::CExtKey((CExtKey *)in_stack_fffffffffffffba8);
      in_stack_fffffffffffffbbb =
           GetDerivedExtKey(in_stack_fffffffffffffbe0,
                            (SigningProvider *)
                            CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                            (CExtKey *)in_RDI,(CExtKey *)this_00);
      if ((bool)in_stack_fffffffffffffbbb) {
        CExtKey::Neuter((CExtKey *)this_01);
        memcpy(&local_118,local_284,0x71);
        if (*(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 1) {
          in_stack_fffffffffffffbba =
               CExtKey::Derive((CExtKey *)this_01,
                               (CExtKey *)
                               CONCAT17(in_stack_fffffffffffffbbf,
                                        CONCAT16(in_stack_fffffffffffffbbe,
                                                 CONCAT15(in_stack_fffffffffffffbbd,
                                                          CONCAT14(in_stack_fffffffffffffbbc,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffbbb,
                                                  CONCAT12(in_stack_fffffffffffffbba,
                                                           CONCAT11(in_stack_fffffffffffffbb9,
                                                                    in_stack_fffffffffffffbb8)))))))
                               ,CONCAT13(in_stack_fffffffffffffbb7,
                                         CONCAT12(in_stack_fffffffffffffbb6,
                                                  CONCAT11(in_stack_fffffffffffffbb5,
                                                           in_stack_fffffffffffffbb4))));
          local_40d = (bool)in_stack_fffffffffffffbba;
        }
        if (*(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 2) {
          in_stack_fffffffffffffbb9 =
               CExtKey::Derive((CExtKey *)this_01,
                               (CExtKey *)
                               CONCAT17(in_stack_fffffffffffffbbf,
                                        CONCAT16(in_stack_fffffffffffffbbe,
                                                 CONCAT15(in_stack_fffffffffffffbbd,
                                                          CONCAT14(in_stack_fffffffffffffbbc,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffbbb,
                                                  CONCAT12(in_stack_fffffffffffffbba,
                                                           CONCAT11(in_stack_fffffffffffffbb9,
                                                                    in_stack_fffffffffffffbb8)))))))
                               ,CONCAT13(in_stack_fffffffffffffbb7,
                                         CONCAT12(in_stack_fffffffffffffbb6,
                                                  CONCAT11(in_stack_fffffffffffffbb5,
                                                           in_stack_fffffffffffffbb4))));
          local_40d = (bool)in_stack_fffffffffffffbb9;
        }
        CExtKey::Neuter((CExtKey *)this_01);
        memcpy(&local_98,local_2f8,0x71);
        bVar1 = CKey::IsValid((CKey *)in_stack_fffffffffffffba8);
        if (bVar1) {
          CExtKey::Neuter((CExtKey *)this_01);
          memcpy(local_18c,local_36c,0x71);
        }
        iVar3 = 0;
      }
      else {
        local_3c9 = 0;
        iVar3 = 1;
      }
      CExtKey::~CExtKey((CExtKey *)in_stack_fffffffffffffba8);
      CExtKey::~CExtKey((CExtKey *)in_stack_fffffffffffffba8);
      if (iVar3 != 0) goto LAB_006f9f70;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffbb7,
                          CONCAT16(in_stack_fffffffffffffbb6,
                                   CONCAT15(in_stack_fffffffffffffbb5,
                                            CONCAT14(in_stack_fffffffffffffbb4,
                                                     in_stack_fffffffffffffbb0)))));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffbb7,
                          CONCAT16(in_stack_fffffffffffffbb6,
                                   CONCAT15(in_stack_fffffffffffffbb5,
                                            CONCAT14(in_stack_fffffffffffffbb4,
                                                     in_stack_fffffffffffffbb0)))));
      while (bVar1 = __gnu_cxx::
                     operator==<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffbbf,
                                            CONCAT16(in_stack_fffffffffffffbbe,
                                                     CONCAT15(in_stack_fffffffffffffbbd,
                                                              CONCAT14(in_stack_fffffffffffffbbc,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffffbbb,
                                                  CONCAT12(in_stack_fffffffffffffbba,
                                                           CONCAT11(in_stack_fffffffffffffbb9,
                                                                    in_stack_fffffffffffffbb8)))))))
                                ,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffbb7,
                                             CONCAT16(in_stack_fffffffffffffbb6,
                                                      CONCAT15(in_stack_fffffffffffffbb5,
                                                               CONCAT14(in_stack_fffffffffffffbb4,
                                                                        in_stack_fffffffffffffbb0)))
                                            )), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     *)in_stack_fffffffffffffba8);
        in_stack_fffffffffffffbb8 =
             CExtPubKey::Derive((CExtPubKey *)this_01,
                                (CExtPubKey *)
                                CONCAT17(in_stack_fffffffffffffbbf,
                                         CONCAT16(in_stack_fffffffffffffbbe,
                                                  CONCAT15(in_stack_fffffffffffffbbd,
                                                           CONCAT14(in_stack_fffffffffffffbbc,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffbbb,
                                                  CONCAT12(in_stack_fffffffffffffbba,
                                                           CONCAT11(in_stack_fffffffffffffbb9,
                                                                    in_stack_fffffffffffffbb8)))))))
                                ,CONCAT13(in_stack_fffffffffffffbb7,
                                          CONCAT12(in_stack_fffffffffffffbb6,
                                                   CONCAT11(in_stack_fffffffffffffbb5,
                                                            in_stack_fffffffffffffbb4))));
        if (!(bool)in_stack_fffffffffffffbb8) {
          local_3c9 = 0;
          goto LAB_006f9f70;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)in_stack_fffffffffffffba8);
      }
      memcpy(&local_98,&local_118,0x71);
      if (*(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 1) {
        in_stack_fffffffffffffbb7 =
             CExtPubKey::Derive((CExtPubKey *)this_01,
                                (CExtPubKey *)
                                CONCAT17(in_stack_fffffffffffffbbf,
                                         CONCAT16(in_stack_fffffffffffffbbe,
                                                  CONCAT15(in_stack_fffffffffffffbbd,
                                                           CONCAT14(in_stack_fffffffffffffbbc,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffbbb,
                                                  CONCAT12(in_stack_fffffffffffffbba,
                                                           CONCAT11(in_stack_fffffffffffffbb9,
                                                                    in_stack_fffffffffffffbb8)))))))
                                ,CONCAT13(in_stack_fffffffffffffbb7,
                                          CONCAT12(in_stack_fffffffffffffbb6,
                                                   CONCAT11(in_stack_fffffffffffffbb5,
                                                            in_stack_fffffffffffffbb4))));
        local_40d = (bool)in_stack_fffffffffffffbb7;
      }
      if (*(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 2) {
        __assert_fail("m_derive != DeriveType::HARDENED",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                      ,0x1bf,
                      "virtual bool (anonymous namespace)::BIP32PubkeyProvider::GetPubKey(int, const SigningProvider &, CPubKey &, KeyOriginInfo &, const DescriptorCache *, DescriptorCache *) const"
                     );
      }
    }
  }
  else {
    in_stack_fffffffffffffbbf =
         DescriptorCache::GetCachedDerivedExtPubKey
                   ((DescriptorCache *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
                    ,(uint32_t)((ulong)in_R8 >> 0x20),(uint32_t)in_R8,in_RDI);
    if (!(bool)in_stack_fffffffffffffbbf) {
      if (*(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 2) {
        local_3c9 = 0;
        goto LAB_006f9f70;
      }
      in_stack_fffffffffffffbbe =
           DescriptorCache::GetCachedParentExtPubKey
                     (this_00,in_stack_fffffffffffffbec,(CExtPubKey *)this_01);
      if (!(bool)in_stack_fffffffffffffbbe) {
        local_3c9 = 0;
        goto LAB_006f9f70;
      }
      memcpy(&local_98,&local_118,0x71);
      if (*(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 1) {
        in_stack_fffffffffffffbbd =
             CExtPubKey::Derive((CExtPubKey *)this_01,
                                (CExtPubKey *)
                                CONCAT17(in_stack_fffffffffffffbbf,
                                         CONCAT16(in_stack_fffffffffffffbbe,
                                                  CONCAT15(in_stack_fffffffffffffbbd,
                                                           CONCAT14(in_stack_fffffffffffffbbc,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffbbb,
                                                  CONCAT12(in_stack_fffffffffffffbba,
                                                           CONCAT11(in_stack_fffffffffffffbb9,
                                                                    in_stack_fffffffffffffbb8)))))))
                                ,CONCAT13(in_stack_fffffffffffffbb7,
                                          CONCAT12(in_stack_fffffffffffffbb6,
                                                   CONCAT11(in_stack_fffffffffffffbb5,
                                                            in_stack_fffffffffffffbb4))));
        local_40d = (bool)in_stack_fffffffffffffbbd;
      }
    }
  }
  if (local_40d == false) {
    local_3c9 = 0;
  }
  else {
    KeyOriginInfo::operator=
              ((KeyOriginInfo *)
               CONCAT17(in_stack_fffffffffffffbbf,
                        CONCAT16(in_stack_fffffffffffffbbe,
                                 CONCAT15(in_stack_fffffffffffffbbd,
                                          CONCAT14(in_stack_fffffffffffffbbc,
                                                   CONCAT13(in_stack_fffffffffffffbbb,
                                                            CONCAT12(in_stack_fffffffffffffbba,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffbb9,
                                                  in_stack_fffffffffffffbb8))))))),
               (KeyOriginInfo *)
               CONCAT17(in_stack_fffffffffffffbb7,
                        CONCAT16(in_stack_fffffffffffffbb6,
                                 CONCAT15(in_stack_fffffffffffffbb5,
                                          CONCAT14(in_stack_fffffffffffffbb4,
                                                   in_stack_fffffffffffffbb0)))));
    memcpy(in_RCX,&local_68,0x41);
    if (in_stack_00000008 != 0) {
      if (*(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 2) {
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_fffffffffffffba8);
        if (sVar2 != 0) {
          DescriptorCache::CacheDerivedExtPubKey
                    (this_01,(uint32_t)((ulong)this_00 >> 0x20),(uint32_t)this_00,
                     (CExtPubKey *)
                     CONCAT17(in_stack_fffffffffffffbbf,
                              CONCAT16(in_stack_fffffffffffffbbe,
                                       CONCAT15(in_stack_fffffffffffffbbd,
                                                CONCAT14(in_stack_fffffffffffffbbc,
                                                         CONCAT13(in_stack_fffffffffffffbbb,
                                                                  CONCAT12(in_stack_fffffffffffffbba
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffbb9,
                                                  in_stack_fffffffffffffbb8))))))));
        }
      }
      else {
        DescriptorCache::CacheParentExtPubKey
                  (this_01,(uint32_t)((ulong)this_00 >> 0x20),
                   (CExtPubKey *)
                   CONCAT17(in_stack_fffffffffffffbbf,
                            CONCAT16(in_stack_fffffffffffffbbe,
                                     CONCAT15(in_stack_fffffffffffffbbd,
                                              CONCAT14(in_stack_fffffffffffffbbc,
                                                       CONCAT13(in_stack_fffffffffffffbbb,
                                                                CONCAT12(in_stack_fffffffffffffbba,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffbb9,
                                                  in_stack_fffffffffffffbb8))))))));
        key_exp_pos = (uint32_t)((ulong)this_00 >> 0x20);
        bVar1 = CPubKey::IsValid((CPubKey *)in_stack_fffffffffffffba8);
        if (bVar1) {
          DescriptorCache::CacheLastHardenedExtPubKey
                    (this_01,key_exp_pos,
                     (CExtPubKey *)
                     CONCAT17(in_stack_fffffffffffffbbf,
                              CONCAT16(in_stack_fffffffffffffbbe,
                                       CONCAT15(in_stack_fffffffffffffbbd,
                                                CONCAT14(in_stack_fffffffffffffbbc,
                                                         CONCAT13(in_stack_fffffffffffffbbb,
                                                                  CONCAT12(in_stack_fffffffffffffbba
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffbb9,
                                                  in_stack_fffffffffffffbb8))))))));
        }
      }
    }
    local_3c9 = 1;
  }
LAB_006f9f70:
  KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffba8);
  KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffba8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_3c9 & 1);
}

Assistant:

bool GetPubKey(int pos, const SigningProvider& arg, CPubKey& key_out, KeyOriginInfo& final_info_out, const DescriptorCache* read_cache = nullptr, DescriptorCache* write_cache = nullptr) const override
    {
        // Info of parent of the to be derived pubkey
        KeyOriginInfo parent_info;
        CKeyID keyid = m_root_extkey.pubkey.GetID();
        std::copy(keyid.begin(), keyid.begin() + sizeof(parent_info.fingerprint), parent_info.fingerprint);
        parent_info.path = m_path;

        // Info of the derived key itself which is copied out upon successful completion
        KeyOriginInfo final_info_out_tmp = parent_info;
        if (m_derive == DeriveType::UNHARDENED) final_info_out_tmp.path.push_back((uint32_t)pos);
        if (m_derive == DeriveType::HARDENED) final_info_out_tmp.path.push_back(((uint32_t)pos) | 0x80000000L);

        // Derive keys or fetch them from cache
        CExtPubKey final_extkey = m_root_extkey;
        CExtPubKey parent_extkey = m_root_extkey;
        CExtPubKey last_hardened_extkey;
        bool der = true;
        if (read_cache) {
            if (!read_cache->GetCachedDerivedExtPubKey(m_expr_index, pos, final_extkey)) {
                if (m_derive == DeriveType::HARDENED) return false;
                // Try to get the derivation parent
                if (!read_cache->GetCachedParentExtPubKey(m_expr_index, parent_extkey)) return false;
                final_extkey = parent_extkey;
                if (m_derive == DeriveType::UNHARDENED) der = parent_extkey.Derive(final_extkey, pos);
            }
        } else if (IsHardened()) {
            CExtKey xprv;
            CExtKey lh_xprv;
            if (!GetDerivedExtKey(arg, xprv, lh_xprv)) return false;
            parent_extkey = xprv.Neuter();
            if (m_derive == DeriveType::UNHARDENED) der = xprv.Derive(xprv, pos);
            if (m_derive == DeriveType::HARDENED) der = xprv.Derive(xprv, pos | 0x80000000UL);
            final_extkey = xprv.Neuter();
            if (lh_xprv.key.IsValid()) {
                last_hardened_extkey = lh_xprv.Neuter();
            }
        } else {
            for (auto entry : m_path) {
                if (!parent_extkey.Derive(parent_extkey, entry)) return false;
            }
            final_extkey = parent_extkey;
            if (m_derive == DeriveType::UNHARDENED) der = parent_extkey.Derive(final_extkey, pos);
            assert(m_derive != DeriveType::HARDENED);
        }
        if (!der) return false;

        final_info_out = final_info_out_tmp;
        key_out = final_extkey.pubkey;

        if (write_cache) {
            // Only cache parent if there is any unhardened derivation
            if (m_derive != DeriveType::HARDENED) {
                write_cache->CacheParentExtPubKey(m_expr_index, parent_extkey);
                // Cache last hardened xpub if we have it
                if (last_hardened_extkey.pubkey.IsValid()) {
                    write_cache->CacheLastHardenedExtPubKey(m_expr_index, last_hardened_extkey);
                }
            } else if (final_info_out.path.size() > 0) {
                write_cache->CacheDerivedExtPubKey(m_expr_index, pos, final_extkey);
            }
        }

        return true;
    }